

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_matrix.cpp
# Opt level: O0

void __thiscall VSMatrix::multMatrix(VSMatrix *this,FLOATTYPE *aMatrix)

{
  int iVar1;
  int local_64;
  int local_60;
  int k;
  int j;
  int i;
  FLOATTYPE res [16];
  FLOATTYPE *aMatrix_local;
  VSMatrix *this_local;
  
  res._56_8_ = aMatrix;
  for (k = 0; k < 4; k = k + 1) {
    for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
      (&j)[local_60 * 4 + k] = 0;
      for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
        iVar1 = local_60 * 4 + k;
        (&j)[iVar1] = (int)(this->mMatrix[local_64 * 4 + k] *
                            *(float *)(res._56_8_ + (long)(local_60 * 4 + local_64) * 4) +
                           (float)(&j)[iVar1]);
      }
    }
  }
  memcpy(this,&j,0x40);
  return;
}

Assistant:

void 
VSMatrix::multMatrix(const FLOATTYPE *aMatrix)
{
	
	FLOATTYPE res[16];

	for (int i = 0; i < 4; ++i) 
	{
		for (int j = 0; j < 4; ++j) 
		{
			res[j*4 + i] = 0.0f;
			for (int k = 0; k < 4; ++k) 
			{
				res[j*4 + i] += mMatrix[k*4 + i] * aMatrix[j*4 + k]; 
			}
		}
	}
	memcpy(mMatrix, res, 16 * sizeof(FLOATTYPE));
}